

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

bool __thiscall MatchTool::match(MatchTool *this,char *txt)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  char cVar2;
  char *pcVar3;
  int curr;
  int local_c;
  
  local_c = 1;
  cVar2 = *txt;
  if (cVar2 != '\0') {
    pcVar3 = txt + 1;
    local_c = 1;
    do {
      local_c = *(int *)(*(long *)&(this->dtran).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_c].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl +
                        (long)cVar2 * 4);
      if (local_c == 0) {
        return false;
      }
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_c);
  return _Var1._M_current !=
         (this->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool MatchTool::match(const char *txt) {
    int curr = 1;
    for (int i = 0; txt[i] != '\0'; i++) {
        curr = dtran[curr][(unsigned long)txt[i]];
        if (curr == 0) return false;
    }
    return std::find(targets.cbegin(), targets.cend(), curr) != targets.cend();
}